

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

TArray<int,_int> * __thiscall
TArray<int,_int>::operator=(TArray<int,_int> *this,TArray<int,_int> *other)

{
  TArray<int,_int> *other_local;
  TArray<int,_int> *this_local;
  
  if (other != this) {
    if (this->Array != (int *)0x0) {
      if (this->Count != 0) {
        DoDelete(this,0,this->Count - 1);
      }
      M_Free(this->Array);
    }
    DoCopy(this,other);
  }
  return this;
}

Assistant:

TArray<T,TT> &operator= (const TArray<T,TT> &other)
	{
		if (&other != this)
		{
			if (Array != NULL)
			{
				if (Count > 0)
				{
					DoDelete (0, Count-1);
				}
				M_Free (Array);
			}
			DoCopy (other);
		}
		return *this;
	}